

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 *pUVar1;
  U16 *pUVar2;
  BYTE *pBVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar6 = (ms->cParams).minMatch;
  uVar9 = 6;
  if (uVar6 < 6) {
    uVar9 = uVar6;
  }
  bVar5 = 5 - ((ms->cParams).searchLog < 5);
  pUVar1 = ms->hashTable;
  pUVar2 = ms->tagTable;
  pBVar3 = (ms->window).base;
  uVar10 = (ulong)ms->nextToUpdate;
  cVar4 = (char)ms->rowHashLog;
  do {
    if (((long)ip - (long)pBVar3 & 0xffffffffU) <= uVar10) {
      ms->nextToUpdate = (U32)((long)ip - (long)pBVar3);
      return;
    }
    if (uVar9 == 5) {
      uVar7 = *(long *)(pBVar3 + uVar10) * -0x30e4432345000000;
LAB_001b2fd0:
      uVar6 = (uint)(uVar7 >> (0x38U - cVar4 & 0x3f));
    }
    else {
      if (uVar9 == 6) {
        uVar7 = *(long *)(pBVar3 + uVar10) * -0x30e4432340650000;
        goto LAB_001b2fd0;
      }
      uVar6 = (uint)(*(int *)(pBVar3 + uVar10) * -0x61c8864f) >> (0x18U - cVar4 & 0x1f);
    }
    uVar7 = (ulong)((uVar6 >> 8) << (bVar5 & 0x1f));
    uVar8 = (byte)pUVar2[uVar7] + 0x1f & ~(-1 << (bVar5 & 0x1f));
    *(char *)(pUVar2 + uVar7) = (char)uVar8;
    *(char *)((long)pUVar2 + (ulong)uVar8 + 1 + uVar7 * 2) = (char)uVar6;
    pUVar1[uVar7 + uVar8] = (U32)uVar10;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* dont use cache */);
}